

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QtDependency>::moveAppend
          (QGenericArrayOps<QtDependency> *this,QtDependency *b,QtDependency *e)

{
  qsizetype *pqVar1;
  QtDependency *pQVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QtDependency>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QtDependency>).size;
      pDVar4 = (b->relativePath).d.d;
      (b->relativePath).d.d = (Data *)0x0;
      pQVar2[lVar3].relativePath.d.d = pDVar4;
      pcVar5 = (b->relativePath).d.ptr;
      (b->relativePath).d.ptr = (char16_t *)0x0;
      pQVar2[lVar3].relativePath.d.ptr = pcVar5;
      qVar6 = (b->relativePath).d.size;
      (b->relativePath).d.size = 0;
      pQVar2[lVar3].relativePath.d.size = qVar6;
      pDVar4 = (b->absolutePath).d.d;
      (b->absolutePath).d.d = (Data *)0x0;
      pQVar2[lVar3].absolutePath.d.d = pDVar4;
      pcVar5 = (b->absolutePath).d.ptr;
      (b->absolutePath).d.ptr = (char16_t *)0x0;
      pQVar2[lVar3].absolutePath.d.ptr = pcVar5;
      qVar6 = (b->absolutePath).d.size;
      (b->absolutePath).d.size = 0;
      pQVar2[lVar3].absolutePath.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QtDependency>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }